

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O2

void __thiscall QPDFParser::warnDuplicateKey(QPDFParser *this)

{
  qpdf_offset_t offset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  offset = this->frame->offset;
  std::operator+(&local_38,"dictionary has duplicated key ",&this->frame->key);
  std::operator+(&bStack_58,&local_38,"; last occurrence overrides earlier ones");
  warn(this,offset,&bStack_58);
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void
QPDFParser::warnDuplicateKey()
{
    QTC::TC("qpdf", "QPDFParser duplicate dict key");
    warn(
        frame->offset,
        "dictionary has duplicated key " + frame->key + "; last occurrence overrides earlier ones");
}